

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O1

void __thiscall
Imf_2_5::ScanLineInputFile::readPixels(ScanLineInputFile *this,int scanLine1,int scanLine2)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  Data *pDVar2;
  InputStreamMutex *streamData;
  OptimizationMode OVar3;
  pointer ppLVar4;
  LineBuffer *pLVar5;
  int iVar6;
  Task *this_00;
  undefined **ppuVar7;
  ArgExc *pAVar8;
  IoExc *this_01;
  long lVar9;
  long lVar10;
  int iVar11;
  string *psVar12;
  string *psVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  bool bVar17;
  TaskGroup taskGroup;
  TaskGroup local_1b8 [392];
  
  __mutex = (pthread_mutex_t *)this->_streamData;
  iVar6 = pthread_mutex_lock(__mutex);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  pDVar2 = this->_data;
  if ((pDVar2->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pDVar2->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar8,"No frame buffer specified as pixel data destination.");
    __cxa_throw(pAVar8,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  iVar6 = scanLine2;
  if (scanLine2 < scanLine1) {
    iVar6 = scanLine1;
    scanLine1 = scanLine2;
  }
  iVar16 = pDVar2->minY;
  if ((scanLine1 < iVar16) || (pDVar2->maxY < iVar6)) {
    pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar8,"Tried to read scan line outside the image file\'s data window.")
    ;
    __cxa_throw(pAVar8,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  bVar17 = pDVar2->lineOrder != INCREASING_Y;
  iVar14 = pDVar2->linesInBuffer;
  iVar1 = scanLine1;
  iVar11 = iVar6;
  if (!bVar17) {
    iVar1 = iVar6;
    iVar11 = scanLine1;
  }
  iVar11 = (iVar11 - iVar16) / iVar14;
  IlmThread_2_5::TaskGroup::TaskGroup(local_1b8);
  iVar16 = (iVar1 - iVar16) / iVar14 + (-(uint)bVar17 | 1);
  if (iVar11 != iVar16) {
    uVar15 = (ulong)iVar11;
    do {
      pDVar2 = this->_data;
      streamData = this->_streamData;
      OVar3 = pDVar2->optimizationMode;
      ppLVar4 = (pDVar2->lineBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pLVar5 = ppLVar4[uVar15 % (ulong)((long)(pDVar2->lineBuffers).
                                              super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)ppLVar4 >> 3)];
      IlmThread_2_5::Semaphore::wait();
      iVar14 = (int)uVar15;
      if (iVar14 != pLVar5->maxY) {
        iVar1 = pDVar2->linesInBuffer;
        iVar11 = iVar1 * iVar14 + pDVar2->minY;
        *(int *)((long)&pLVar5->dataPtr + 4) = iVar11;
        pLVar5->dataSize = iVar1 + iVar11 + -1;
        pLVar5->maxY = iVar14;
        (pLVar5->buffer)._size = 0;
        anon_unknown_7::readPixelData
                  (streamData,pDVar2,iVar11,&(pLVar5->buffer)._data,(int *)&pLVar5->dataPtr);
      }
      iVar14 = *(int *)((long)&pLVar5->dataPtr + 4);
      if (iVar14 <= scanLine1) {
        iVar14 = scanLine1;
      }
      iVar1 = pLVar5->dataSize;
      if (iVar6 <= pLVar5->dataSize) {
        iVar1 = iVar6;
      }
      if (((ulong)OVar3 & 1) == 0) {
        this_00 = (Task *)operator_new(0x30);
        IlmThread_2_5::Task::Task(this_00,local_1b8);
        ppuVar7 = &PTR__LineBufferTask_0036b850;
      }
      else {
        this_00 = (Task *)operator_new(0x30);
        IlmThread_2_5::Task::Task(this_00,local_1b8);
        ppuVar7 = &PTR__LineBufferTaskIIF_0036b810;
      }
      *(undefined ***)this_00 = ppuVar7;
      *(Data **)(this_00 + 0x10) = pDVar2;
      *(LineBuffer **)(this_00 + 0x18) = pLVar5;
      *(int *)(this_00 + 0x20) = iVar14;
      *(int *)(this_00 + 0x24) = iVar1;
      *(OptimizationMode *)(this_00 + 0x28) = OVar3;
      IlmThread_2_5::ThreadPool::addGlobalTask(this_00);
      uVar15 = uVar15 + (-(ulong)bVar17 | 1);
    } while (iVar16 != (int)uVar15);
  }
  IlmThread_2_5::TaskGroup::~TaskGroup(local_1b8);
  ppLVar4 = (this->_data->lineBuffers).
            super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar9 = (long)(this->_data->lineBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar4;
  if (lVar9 == 0) {
    psVar12 = (string *)0x0;
  }
  else {
    lVar9 = lVar9 >> 3;
    lVar10 = 0;
    psVar13 = (string *)0x0;
    do {
      pLVar5 = ppLVar4[lVar10];
      psVar12 = (string *)&pLVar5->compressor;
      if (psVar13 != (string *)0x0) {
        psVar12 = psVar13;
      }
      if ((char)pLVar5->scanLineMin == '\0') {
        psVar12 = psVar13;
      }
      *(undefined1 *)&pLVar5->scanLineMin = 0;
      lVar10 = lVar10 + 1;
      psVar13 = psVar12;
    } while (lVar9 + (ulong)(lVar9 == 0) != lVar10);
  }
  if (psVar12 != (string *)0x0) {
    this_01 = (IoExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::IoExc::IoExc(this_01,psVar12);
    __cxa_throw(this_01,&Iex_2_5::IoExc::typeinfo,Iex_2_5::IoExc::~IoExc);
  }
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void	
ScanLineInputFile::readPixels (int scanLine1, int scanLine2)
{
    try
    {
        Lock lock (*_streamData);

	if (_data->slices.size() == 0)
	    throw IEX_NAMESPACE::ArgExc ("No frame buffer specified "
			       "as pixel data destination.");

	int scanLineMin = min (scanLine1, scanLine2);
	int scanLineMax = max (scanLine1, scanLine2);

	if (scanLineMin < _data->minY || scanLineMax > _data->maxY)
	    throw IEX_NAMESPACE::ArgExc ("Tried to read scan line outside "
			       "the image file's data window.");

        //
        // We impose a numbering scheme on the lineBuffers where the first
        // scanline is contained in lineBuffer 1.
        //
        // Determine the first and last lineBuffer numbers in this scanline
        // range. We always attempt to read the scanlines in the order that
        // they are stored in the file.
        //

        int start, stop, dl;

        if (_data->lineOrder == INCREASING_Y)
        {
            start = (scanLineMin - _data->minY) / _data->linesInBuffer;
            stop  = (scanLineMax - _data->minY) / _data->linesInBuffer + 1;
            dl = 1;
        }
        else
        {
            start = (scanLineMax - _data->minY) / _data->linesInBuffer;
            stop  = (scanLineMin - _data->minY) / _data->linesInBuffer - 1;
            dl = -1;
        }

        //
        // Create a task group for all line buffer tasks.  When the
	// task group goes out of scope, the destructor waits until
	// all tasks are complete.
        //
        
        {
            TaskGroup taskGroup;
    
            //
            // Add the line buffer tasks.
            //
            // The tasks will execute in the order that they are created
            // because we lock the line buffers during construction and the
            // constructors are called by the main thread.  Hence, in order
	    // for a successive task to execute the previous task which
	    // used that line buffer must have completed already.
            //
    
            for (int l = start; l != stop; l += dl)
            {
                ThreadPool::addGlobalTask (newLineBufferTask (&taskGroup,
                                                              _streamData,
                                                              _data, l,
                                                              scanLineMin,
                                                              scanLineMax,
                                                              _data->optimizationMode));
            }
        
	    //
            // finish all tasks
	    //
        }
        
	//
	// Exeption handling:
	//
	// LineBufferTask::execute() may have encountered exceptions, but
	// those exceptions occurred in another thread, not in the thread
	// that is executing this call to ScanLineInputFile::readPixels().
	// LineBufferTask::execute() has caught all exceptions and stored
	// the exceptions' what() strings in the line buffers.
	// Now we check if any line buffer contains a stored exception; if
	// this is the case then we re-throw the exception in this thread.
	// (It is possible that multiple line buffers contain stored
	// exceptions.  We re-throw the first exception we find and
	// ignore all others.)
	//

	const string *exception = 0;

        for (size_t i = 0; i < _data->lineBuffers.size(); ++i)
	{
            LineBuffer *lineBuffer = _data->lineBuffers[i];

	    if (lineBuffer->hasException && !exception)
		exception = &lineBuffer->exception;

	    lineBuffer->hasException = false;
	}

	if (exception)
	    throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
	REPLACE_EXC (e, "Error reading pixel data from image "
                 "file \"" << fileName() << "\". " << e.what());
	throw;
    }
}